

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O1

void __thiscall
TEST_UnitTestMacros_MultipleCHECK_THROWS_inOneScope_Test::testBody
          (TEST_UnitTestMacros_MultipleCHECK_THROWS_inOneScope_Test *this)

{
  undefined4 *puVar1;
  SimpleString failure_msg;
  SimpleString aSStack_38 [2];
  
  SimpleString::SimpleString(aSStack_38,"expected to throw int\nbut threw nothing");
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 4;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

TEST(UnitTestMacros, MultipleCHECK_THROWS_inOneScope)
{
    CHECK_THROWS(int, throw 4);
    CHECK_THROWS(int, throw 4);
}